

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

BBox3fa * __thiscall embree::SceneGraph::Node::bounds(Node *this,size_t i)

{
  BBox3fa *in_RDI;
  float fVar1;
  
  fVar1 = std::numeric_limits<float>::infinity();
  *(ulong *)&(in_RDI->lower).field_0 = CONCAT44(fVar1,fVar1);
  *(ulong *)((long)&(in_RDI->lower).field_0 + 8) = CONCAT44(fVar1,fVar1);
  fVar1 = std::numeric_limits<float>::infinity();
  *(ulong *)&(in_RDI->upper).field_0 = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  *(ulong *)((long)&(in_RDI->upper).field_0 + 8) = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  return in_RDI;
}

Assistant:

virtual BBox3fa bounds(size_t i) const {
        return empty;
      }